

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

int cfgfile::format_t<int,_cfgfile::string_trait_t>::from_string
              (parser_info_t<cfgfile::string_trait_t> *info,string_t *value)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  parser_info_t<cfgfile::string_trait_t> *in_RDI;
  exception *anon_var_0;
  int result;
  size_t pos;
  string *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  string_t *in_stack_fffffffffffffb78;
  exception_t<cfgfile::string_trait_t> *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  allocator *__rhs;
  allocator *__lhs;
  allocator local_229;
  string local_228 [103];
  allocator local_1c1;
  string local_1c0 [71];
  allocator local_179;
  string local_178 [71];
  allocator local_131;
  string local_130 [276];
  int local_1c;
  long local_18;
  parser_info_t<cfgfile::string_trait_t> *local_8;
  
  local_18 = 0;
  local_8 = in_RDI;
  local_1c = std::__cxx11::stoi(in_stack_fffffffffffffb70,(size_t *)in_stack_fffffffffffffb68,0);
  lVar1 = local_18;
  lVar2 = std::__cxx11::string::length();
  if (lVar1 != lVar2) {
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Invalid value: \"",&local_131);
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    __lhs = &local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"\". In file \"",__lhs);
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   in_stack_fffffffffffffba0);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_8);
    std::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    __rhs = &local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"\" on line ",__rhs);
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_8);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffb68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,".",&local_229);
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  return local_1c;
}

Assistant:

static int from_string( const parser_info_t< string_trait_t > & info,
		const string_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			int result = std::stoi( value, &pos );

			if( pos != value.length() )
				throw exception_t< string_trait_t >(
					string_trait_t::from_ascii( "Invalid value: \"" ) +
					value + string_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					string_trait_t::from_ascii( "\" on line " ) +
					string_trait_t::to_string( info.line_number() ) +
					string_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< string_trait_t >(
				string_trait_t::from_ascii( "Invalid value: \"" ) +
				value + string_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() + string_trait_t::from_ascii( "\" on line " ) +
				string_trait_t::to_string( info.line_number() ) +
				string_trait_t::from_ascii( "." ) );
		}
	}